

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TimingControlStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TimingControlSyntax&,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,TimingControlSyntax *args_2,
          StatementSyntax *args_3)

{
  TimingControlStatementSyntax *pTVar1;
  StatementSyntax *in_RCX;
  BumpAllocator *in_RDX;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RSI;
  NamedLabelSyntax *in_RDI;
  size_t in_R8;
  TimingControlStatementSyntax *unaff_retaddr;
  
  pTVar1 = (TimingControlStatementSyntax *)allocate(in_RDX,(size_t)in_RCX,in_R8);
  slang::syntax::TimingControlStatementSyntax::TimingControlStatementSyntax
            (unaff_retaddr,in_RDI,in_RSI,(TimingControlSyntax *)in_RDX,in_RCX);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }